

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# braille.hpp
# Opt level: O1

ostream * plot::detail::braille::operator<<(ostream *stream,line_t *line)

{
  float fVar1;
  float fVar2;
  TerminalMode TVar3;
  BrailleCanvas *pBVar4;
  size_t sVar5;
  block_t *pbVar6;
  ostream *poVar7;
  foreground_setter *pfVar8;
  long lVar9;
  float fVar10;
  undefined1 local_45;
  foreground_setter local_44;
  
  pBVar4 = line->canvas_;
  TVar3 = (pBVar4->term_).mode;
  if ((TVar3 != None) && (TVar3 != Windows)) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\x1b[0m",4);
  }
  TVar3 = (pBVar4->term_).mode;
  if ((TVar3 != None) && (TVar3 != Windows)) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\x1b[1m",4);
  }
  sVar5 = pBVar4->cols_;
  if (sVar5 != 0) {
    pbVar6 = (line->it_)._M_current;
    lVar9 = 0;
    do {
      if ((&pbVar6->pixels)[lVar9] == '\0') {
        local_44.mode = CONCAT31(local_44.mode._1_3_,0x20);
        pfVar8 = &local_44;
        poVar7 = stream;
      }
      else {
        fVar1 = *(float *)((long)&(pbVar6->color).a + lVar9);
        fVar2 = (pBVar4->background_).a;
        fVar10 = 1.0 - fVar1;
        local_44.color.a = fVar10 * fVar2 + fVar1;
        local_44.color.r =
             (((pBVar4->background_).r * fVar2 * fVar10 +
              *(float *)((long)&(pbVar6->color).r + lVar9) * fVar1) / local_44.color.a) *
             local_44.color.a;
        local_44.color.g =
             (((pBVar4->background_).g * fVar2 * fVar10 +
              *(float *)((long)&(pbVar6->color).g + lVar9) * fVar1) / local_44.color.a) *
             local_44.color.a;
        local_44.color.b =
             (((pBVar4->background_).b * fVar2 * fVar10 +
              *(float *)((long)&(pbVar6->color).b + lVar9) * fVar1) / local_44.color.a) *
             local_44.color.a;
        local_44.mode = (pBVar4->term_).mode;
        poVar7 = detail::operator<<(stream,&local_44);
        local_45 = 0xe2;
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_45,1);
        local_45 = (&pbVar6->pixels)[lVar9] >> 6 | 0xa0;
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_45,1);
        local_45 = (&pbVar6->pixels)[lVar9] & 0x3f | 0x80;
        pfVar8 = (foreground_setter *)&local_45;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)pfVar8,1);
      lVar9 = lVar9 + 0x14;
    } while (sVar5 * 0x14 != lVar9);
  }
  TVar3 = (pBVar4->term_).mode;
  if ((TVar3 != None) && (TVar3 != Windows)) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\x1b[0m",4);
  }
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, line_t const& line) {
        auto const& canvas = *line.canvas_;
        auto const& term = canvas.term_;

        // Reset attributes + Bold mode
        // XXX: Empty dots in braille patterns are often rendered as empty
        // XXX: circles unless in bold mode.
        stream << term.reset() << term.bold();

        // Unicode braille patterns are 0x28xx
        // In binary:
        //   0b00101000'xxxxxxxx
        // In UTF-8:
        //   0b1110'0010, 0b10'1000'xx 0b10'xxxxxx

        for (auto it = line.it_, end = line.it_+canvas.cols_; it != end; ++it) {
            if (it->pixels) {
                stream << term.foreground(it->color.over(canvas.background_).premultiplied())
                       << char(0b1110'0010)
                       << char(0b10'1000'00 | ((it->pixels & 0b11'000000) >> 6))
                       << char(0b10'000000 | (it->pixels & 0b00'111111));
            } else {
                stream << ' ';
            }
        }

        return stream << term.reset();
    }